

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmGen9TextureCalc::Get2DMipMapHeight(GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint32_t uVar1;
  int iVar2;
  GMM_PLATFORM_INFO *pGVar3;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_6c;
  uint32_t local_54;
  uint32_t AlignedHeightLines;
  GMM_PLATFORM_INFO *pPlatform;
  uint8_t Compressed;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t VAlign;
  uint32_t MipLevel;
  uint32_t i;
  uint32_t HeightLinesLevel2;
  uint32_t HeightLinesLevel1;
  uint32_t HeightLinesLevel0;
  uint32_t MipHeight;
  uint32_t BlockHeight;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  _MipHeight = pTexInfo;
  pTexInfo_local = (GMM_TEXTURE_INFO *)this;
  pGVar3 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  pPlatform._3_1_ = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,_MipHeight->Format);
  HeightLinesLevel1 = _MipHeight->BaseHeight;
  CompressHeight = _MipHeight->MaxLod;
  CompressWidth = (_MipHeight->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,_MipHeight->Format,(uint32_t *)&stack0xffffffffffffffc0,
             &CompressDepth,(uint32_t *)((long)&pPlatform + 4));
  if ((((ulong)(_MipHeight->Flags).Gpu >> 6 & 1) == 0) &&
     (((ulong)(_MipHeight->Flags).Gpu >> 0x1d & 1) == 0)) {
    local_6c = 1;
  }
  else {
    local_6c = (_MipHeight->MSAA).NumSamples;
  }
  HeightLinesLevel2 =
       GmmTextureCalc::ExpandHeight
                 (&this->super_GmmTextureCalc,HeightLinesLevel1,CompressWidth,local_6c);
  if (pPlatform._3_1_ == '\0') {
    if ((((ulong)(_MipHeight->Flags).Gpu >> 0x1d & 1) == 0) ||
       (((ulong)(_MipHeight->Flags).Info >> 0x22 & 1) == 0)) {
      if ((((ulong)(_MipHeight->Flags).Gpu >> 1 & 1) != 0) &&
         (((ulong)(_MipHeight->Flags).Gpu >> 0x29 & 1) != 0)) {
        HeightLinesLevel2 = HeightLinesLevel2 >> 4;
      }
    }
    else {
      HeightLinesLevel2 = HeightLinesLevel2 >> 1;
    }
  }
  else {
    HeightLinesLevel2 = HeightLinesLevel2 / CompressDepth;
  }
  HeightLinesLevel0 = HeightLinesLevel2;
  if (((((ulong)(_MipHeight->Flags).Info >> 0x25 & 1) == 0) &&
      (((ulong)(_MipHeight->Flags).Info >> 0x26 & 1) == 0)) ||
     (((_MipHeight->Alignment).MipTailStartLod != 0 && (_MipHeight->MaxLod != 0)))) {
    MipLevel = 0;
    i = 0;
    for (VAlign = 1; uVar1 = i, VAlign <= CompressHeight; VAlign = VAlign + 1) {
      if (((((ulong)(_MipHeight->Flags).Info >> 0x25 & 1) != 0) ||
          (((ulong)(_MipHeight->Flags).Info >> 0x26 & 1) != 0)) &&
         (VAlign == (_MipHeight->Alignment).MipTailStartLod)) {
        uVar1 = pGVar3->TileInfo[_MipHeight->TileMode].LogicalTileHeight;
        if (VAlign != 1) {
          MipLevel = uVar1 + MipLevel;
          uVar1 = i;
        }
        break;
      }
      HeightLinesLevel1 =
           (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x19])(this,_MipHeight,(ulong)VAlign)
      ;
      if ((((ulong)(_MipHeight->Flags).Gpu >> 6 & 1) == 0) &&
         (((ulong)(_MipHeight->Flags).Gpu >> 0x1d & 1) == 0)) {
        local_78 = 1;
      }
      else {
        local_78 = (_MipHeight->MSAA).NumSamples;
      }
      local_54 = GmmTextureCalc::ExpandHeight
                           (&this->super_GmmTextureCalc,HeightLinesLevel1,CompressWidth,local_78);
      if (pPlatform._3_1_ == '\0') {
        if ((((ulong)(_MipHeight->Flags).Gpu >> 0x1d & 1) == 0) ||
           (((ulong)(_MipHeight->Flags).Info >> 0x22 & 1) == 0)) {
          if ((((ulong)(_MipHeight->Flags).Gpu >> 1 & 1) != 0) &&
             (((ulong)(_MipHeight->Flags).Gpu >> 0x29 & 1) != 0)) {
            local_54 = local_54 >> 4;
          }
        }
        else {
          local_54 = local_54 >> 1;
        }
      }
      else {
        local_54 = local_54 / CompressDepth;
      }
      if (VAlign == 1) {
        i = local_54;
      }
      else {
        MipLevel = local_54 + MipLevel;
      }
    }
    i = uVar1;
    if ((((ulong)(_MipHeight->Flags).Info >> 0x25 & 1) == 0) &&
       (((ulong)(_MipHeight->Flags).Info >> 0x26 & 1) == 0)) {
      if (i < MipLevel) {
        iVar2 = (MipLevel + (CompressWidth - 1)) -
                (MipLevel + (CompressWidth - 1) & CompressWidth - 1);
      }
      else {
        iVar2 = (i + (CompressWidth - 1)) - (i + (CompressWidth - 1) & CompressWidth - 1);
      }
      HeightLinesLevel0 = iVar2 + HeightLinesLevel0;
    }
    else {
      if (i < MipLevel) {
        local_7c = MipLevel;
      }
      else {
        local_7c = i;
      }
      HeightLinesLevel0 =
           (local_7c + HeightLinesLevel0 +
           (pGVar3->TileInfo[_MipHeight->TileMode].LogicalTileHeight - 1)) -
           (local_7c + HeightLinesLevel0 +
            (pGVar3->TileInfo[_MipHeight->TileMode].LogicalTileHeight - 1) &
           pGVar3->TileInfo[_MipHeight->TileMode].LogicalTileHeight - 1);
    }
  }
  return HeightLinesLevel0;
}

Assistant:

uint32_t GmmLib::GmmGen9TextureCalc::Get2DMipMapHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t BlockHeight, MipHeight;
    uint32_t HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t i, MipLevel, VAlign, CompressHeight, CompressWidth, CompressDepth;
    uint8_t  Compressed;
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    MipHeight  = pTexInfo->BaseHeight;
    MipLevel   = pTexInfo->MaxLod;
    VAlign     = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

    if(Compressed)
    {
        HeightLinesLevel0 /= CompressHeight;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
    {
        HeightLinesLevel0 /= 2;
    }
    else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        HeightLinesLevel0 /= 16;
    }

    // Mip0 height...
    BlockHeight = HeightLinesLevel0;

    if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Height is already aligned.
    }
    else
    {
        // Height of Mip1 and Mip2..n needed later...
        HeightLinesLevel1 = HeightLinesLevel2 = 0;
        for(i = 1; i <= MipLevel; i++)
        {
            uint32_t AlignedHeightLines;

            if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                AlignedHeightLines = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }

                break;
            }
            else
            {
                MipHeight = GmmTexGetMipHeight(pTexInfo, i);

                AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedHeightLines /= CompressHeight;
                }
                else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
                {
                    AlignedHeightLines /= 2;
                }
                else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
                {
                    AlignedHeightLines /= 16;
                }

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }
            }
        }

        // If Mip1 height covers all others, then that is all we need...
        if(!(pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs))
        {
            if(HeightLinesLevel1 >= HeightLinesLevel2)
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel1, VAlign);
            }
            else
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel2, VAlign);
            }
        }
        else
        {
            //TR mode- requires TileMode height alignment
            BlockHeight += (HeightLinesLevel1 >= HeightLinesLevel2) ? HeightLinesLevel1 : HeightLinesLevel2;
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }
    }

    GMM_DPF_EXIT;

    return (BlockHeight);
}